

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2.cpp
# Opt level: O3

int32_t utrie2_internalU8NextIndex_63(UTrie2 *trie,UChar32 c,uint8_t *src,uint8_t *limit)

{
  ushort uVar1;
  uint in_EAX;
  uint uVar2;
  int iVar3;
  int32_t length;
  uint16_t *puVar4;
  uint uVar5;
  int32_t i;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  length = 7;
  if ((long)limit - (long)src < 8) {
    length = (int32_t)((long)limit - (long)src);
  }
  uVar2 = utf8_nextCharSafeBody_63(src,(int32_t *)((long)&uStack_18 + 4),length,c,-1);
  if (uVar2 < 0xd800) {
    puVar4 = trie->index;
    uVar5 = uVar2 >> 5;
LAB_003070c9:
    uVar1 = puVar4[uVar5];
  }
  else {
    if (uVar2 < 0x10000) {
      uVar5 = (uVar2 >> 5) + 0x140;
      if (0xdbff < uVar2) {
        uVar5 = uVar2 >> 5;
      }
      puVar4 = trie->index;
      goto LAB_003070c9;
    }
    if (0x10ffff < uVar2) {
      iVar3 = 0x80;
      if (trie->data32 == (uint32_t *)0x0) {
        iVar3 = trie->indexLength + 0x80;
      }
      goto LAB_003070d3;
    }
    if (trie->highStart <= (int)uVar2) {
      iVar3 = trie->highValueIndex;
      goto LAB_003070d3;
    }
    uVar1 = trie->index[(uVar2 >> 5 & 0x3f) + (uint)trie->index[(ulong)(uVar2 >> 0xb) + 0x820]];
  }
  iVar3 = (uVar2 & 0x1f) + (uint)uVar1 * 4;
LAB_003070d3:
  return iVar3 << 3 | uStack_18._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
utrie2_internalU8NextIndex(const UTrie2 *trie, UChar32 c,
                           const uint8_t *src, const uint8_t *limit) {
    int32_t i, length;
    i=0;
    /* support 64-bit pointers by avoiding cast of arbitrary difference */
    if((limit-src)<=7) {
        length=(int32_t)(limit-src);
    } else {
        length=7;
    }
    c=utf8_nextCharSafeBody(src, &i, length, c, -1);
    return u8Index(trie, c, i);
}